

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTzTransition>::resize(QList<QTzTransition> *this,qsizetype size)

{
  qsizetype qVar1;
  QArrayDataPointer<QTzTransition> *in_RSI;
  QArrayDataPointer<QTzTransition> *in_RDI;
  QList<QTzTransition> *unaff_retaddr;
  QArrayDataPointer<QTzTransition> *this_00;
  
  resize_internal(unaff_retaddr,(qsizetype)in_RDI);
  this_00 = in_RSI;
  qVar1 = QList<QTzTransition>::size((QList<QTzTransition> *)in_RDI);
  if (qVar1 < (long)in_RSI) {
    QArrayDataPointer<QTzTransition>::operator->(in_RDI);
    QArrayDataPointer<QTzTransition>::appendInitialize(this_00,(qsizetype)in_RSI);
  }
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }